

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O1

pair<unsigned_long,_std::tuple<std::vector<int,_std::allocator<int>_>_>_> * __thiscall
cppqc::detail::
doShrink<std::vector<int,std::allocator<int>>,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
          (pair<unsigned_long,_std::tuple<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,detail *this,
          Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
          *prop,Input *in,duration<double,_std::ratio<1L,_1L>_> timeout,ostream *out)

{
  bool bVar1;
  pointer piVar2;
  pointer ptVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  pointer __x;
  int iVar7;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
  shrinks;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_88;
  pair<unsigned_long,_std::tuple<std::vector<int,_std::allocator<int>_>_>_> *local_68;
  unsigned_long local_60;
  ostream *local_58;
  rep_conflict local_50;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
  local_48;
  
  local_68 = __return_storage_ptr__;
  local_58 = (ostream *)in;
  local_50 = timeout.__r;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_88,(vector<int,_std::allocator<int>_> *)prop);
  local_60 = 0;
  lVar5 = std::chrono::_V2::steady_clock::now();
  do {
    (**(code **)(**(long **)(this + 8) + 0x18))(&local_48,*(long **)(this + 8),&local_88);
    ptVar3 = local_48.
             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__x = local_48.
               super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __x != ptVar3; __x = __x + 1) {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_a8,(vector<int,_std::allocator<int>_> *)__x);
      lVar6 = std::chrono::_V2::steady_clock::now();
      if ((double)(lVar6 - lVar5) / 1000000000.0 < local_50) {
        cVar4 = (**(code **)(*(long *)this + 0x30))(this,&local_a8);
        piVar2 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (cVar4 == '\0') {
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          if (piVar2 != (pointer)0x0) {
            operator_delete(piVar2);
          }
          local_60 = local_60 + 1;
          iVar7 = 2;
          goto LAB_001e73df;
        }
        iVar7 = 0;
        bVar1 = true;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_58,"Shrinking timed out...\n",0x17)
        ;
        iVar7 = 3;
LAB_001e73df:
        bVar1 = false;
      }
      if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (!bVar1) goto LAB_001e7402;
    }
    iVar7 = 3;
LAB_001e7402:
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector(&local_48);
    if ((iVar7 == 0) || (iVar7 == 3)) {
      local_68->first = local_60;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_68->second,&local_88);
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return local_68;
    }
  } while( true );
}

Assistant:

std::pair<std::size_t, typename Property<T0, T1, T2, T3, T4>::Input> doShrink(
    const Property<T0, T1, T2, T3, T4>& prop,
    const typename Property<T0, T1, T2, T3, T4>::Input& in,
    std::chrono::duration<double> timeout,
    std::ostream& out = std::cout) {
  using Input = typename Property<T0, T1, T2, T3, T4>::Input;

  std::size_t numShrinks = 0;
  Input shrunk = in;
  const auto start = std::chrono::steady_clock::now();

  auto isTimeoutReached = [start, timeout]() {
    const std::chrono::duration<double> elapsed =
        std::chrono::steady_clock::now() - start;
    return elapsed >= timeout;
  };

  try {
  continueShrinking:
    std::vector<Input> shrinks = prop.shrinkInput(shrunk);
    for (Input input : shrinks) {
      if (isTimeoutReached()) {
        out << "Shrinking timed out...\n";
        break;
      }

      if (!prop.checkInput(input)) {
        shrunk = std::move(input);
        numShrinks++;
        goto continueShrinking;
      }
    }
  } catch (...) {
  }
  return std::make_pair(numShrinks, shrunk);
}